

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O3

uint32_t __thiscall Constant::toDot(Constant *this,stringstream *ss)

{
  ostream *poVar1;
  char local_38;
  undefined7 uStack_37;
  long local_30;
  long local_28 [2];
  
  local_38 = '\t';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),&local_38,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_38 = ' ';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_38,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"[shape=box, label=\"Const\\nval: ",0x1f);
  (**((this->super_Expr).op.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_Token)(&local_38);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)CONCAT71(uStack_37,local_38),local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,", fillcolor=\"#f1f8e9\", style=filled]",0x24);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((long *)CONCAT71(uStack_37,local_38) != local_28) {
    operator_delete((long *)CONCAT71(uStack_37,local_38),local_28[0] + 1);
  }
  return (uint32_t)this;
}

Assistant:

uint32_t toDot(std::stringstream& ss) override {
		uint32_t id = hash(this);
		ss << '\t' << id << ' ' << "[shape=box, label=\"Const\\nval: " << op->toString() << "\"" << ", fillcolor=\"#f1f8e9\", style=filled]" << std::endl;
		return id;
	}